

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

FieldGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetFieldGeneratorInfo
          (Context *this,FieldDescriptor *field)

{
  second_type *psVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  FieldDescriptor *field_local;
  LogMessage local_48;
  
  field_local = field;
  psVar1 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>>
                     (&this->field_generator_info_map_,&field_local);
  if (psVar1 == (second_type *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xaf);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"Can not find FieldGeneratorInfo for field: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)(*(long *)(field_local + 8) + 0x20));
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return psVar1;
}

Assistant:

const FieldGeneratorInfo* Context::GetFieldGeneratorInfo(
    const FieldDescriptor* field) const {
  const FieldGeneratorInfo* result =
      FindOrNull(field_generator_info_map_, field);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find FieldGeneratorInfo for field: "
               << field->full_name();
  }
  return result;
}